

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_clnt.c
# Opt level: O2

_Bool rpcb_set(rpcprog_t program,rpcvers_t version,netconfig *nconf,netbuf *address)

{
  mem_format_t p_Var1;
  __uid_t _Var2;
  clnt_stat cVar3;
  CLIENT *clnt;
  clnt_req *cc;
  AUTH *auth;
  char *pcVar4;
  timespec timeout;
  clnt_stat __num;
  bool_t rslt;
  RPCB parms;
  char uidbuf [32];
  
  rslt = 0;
  if (nconf == (netconfig *)0x0) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      __num = RPC_UNKNOWNPROTO;
LAB_00111d35:
      p_Var1 = __ntirpc_pkg_params.warnx_;
      pcVar4 = clnt_sperrno(__num);
      (*p_Var1)("%s: %s","rpcb_set",pcVar4);
      return false;
    }
  }
  else if (address == (netbuf *)0x0) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      __num = RPC_UNKNOWNADDR;
      goto LAB_00111d35;
    }
  }
  else {
    clnt = local_rpcb("rpcb_set");
    if ((clnt->cl_error).re_status == RPC_SUCCESS) {
      parms.r_addr = taddr2uaddr(nconf,address);
      if (parms.r_addr != (char *)0x0) {
        parms.r_netid = nconf->nc_netid;
        parms.r_prog = program;
        parms.r_vers = version;
        _Var2 = geteuid();
        snprintf(uidbuf,0x20,"%d",(ulong)_Var2);
        parms.r_owner = uidbuf;
        cc = (clnt_req *)
             (*__ntirpc_pkg_params.malloc_)
                       (0x2e0,
                        "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpcb_clnt.c"
                        ,0x1cf,"rpcb_set");
        auth = authnone_ncreate();
        clnt_req_fill(cc,clnt,auth,1,xdr_rpcb,&parms,xdr_bool,&rslt);
        timeout.tv_nsec = to.tv_nsec;
        timeout.tv_sec = to.tv_sec;
        cVar3 = clnt_req_setup(cc,timeout);
        if ((cVar3 != RPC_SUCCESS) || (cVar3 = clnt_req_wait_reply(cc), cVar3 != RPC_SUCCESS)) {
          pcVar4 = rpc_sperror(&cc->cc_error,"rpcb_set");
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s",pcVar4);
          }
          (*__ntirpc_pkg_params.free_size_)(pcVar4,0x100);
        }
        clnt_req_release(cc);
        clnt_destroy_it(clnt,"rpcb_set",0x1df);
        (*__ntirpc_pkg_params.free_size_)(parms.r_addr,0);
        return rslt != 0;
      }
      clnt_destroy_it(clnt,"rpcb_set",0x1bf);
      if (((byte)__ntirpc_pkg_params.debug_flags & 4) != 0) {
        __num = RPC_N2AXLATEFAILURE;
        goto LAB_00111d35;
      }
    }
    else {
      clnt_destroy_it(clnt,"rpcb_set",0x1b6);
    }
  }
  return false;
}

Assistant:

bool
rpcb_set(rpcprog_t program, rpcvers_t version, const struct netconfig *nconf,
	 /* Network structure of transport */
	 const struct netbuf *address /* Services netconfig address */)
{
	CLIENT *client;
	struct clnt_req *cc;
	RPCB parms;
	char uidbuf[32];
	enum clnt_stat stat;
	bool_t rslt = false;	/* yes, bool_t */

	/* parameter checking */
	if (nconf == NULL) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR, "%s: %s",
			__func__, clnt_sperrno(RPC_UNKNOWNPROTO));
		return (false);
	}
	if (address == NULL) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR, "%s: %s",
			__func__, clnt_sperrno(RPC_UNKNOWNADDR));
		return (false);
	}
	client = local_rpcb(__func__);
	if (CLNT_FAILURE(client)) {
		CLNT_DESTROY(client);
		return (false);
	}

	/* convert to universal */
	/*LINTED const castaway */
	parms.r_addr =
	    taddr2uaddr((struct netconfig *)nconf, (struct netbuf *)address);
	if (!parms.r_addr) {
		CLNT_DESTROY(client);
		__warnx(TIRPC_DEBUG_FLAG_WARN, "%s: %s",
			__func__, clnt_sperrno(RPC_N2AXLATEFAILURE));
		return (false);	/* no universal address */
	}
	parms.r_prog = program;
	parms.r_vers = version;
	parms.r_netid = nconf->nc_netid;
	/*
	 * Though uid is not being used directly, we still send it for
	 * completeness.  For non-unix platforms, perhaps some other
	 * string or an empty string can be sent.
	 */
	(void)snprintf(uidbuf, sizeof(uidbuf), "%d", geteuid());
	parms.r_owner = uidbuf;

	cc = mem_alloc(sizeof(*cc));
	clnt_req_fill(cc, client, authnone_ncreate(), RPCBPROC_SET,
		      (xdrproc_t) xdr_rpcb, &parms,
		      (xdrproc_t) xdr_bool, &rslt);
	stat = clnt_req_setup(cc, to);
	if (stat == RPC_SUCCESS) {
		stat = CLNT_CALL_WAIT(cc);
	}
	if (stat != RPC_SUCCESS) {
		char *t = rpc_sperror(&cc->cc_error, __func__);

		__warnx(TIRPC_DEBUG_FLAG_ERROR, "%s", t);
		mem_free(t, RPC_SPERROR_BUFLEN);
	}

	clnt_req_release(cc);
	CLNT_DESTROY(client);
	mem_free(parms.r_addr, 0);
	return (rslt);
}